

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZReschedulableTask.cpp
# Opt level: O0

void __thiscall TPZReschedulableTask::start(TPZReschedulableTask *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  bool executed;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,in_RDI);
  bVar1 = (in_RDI->super___mutex_base)._M_mutex.__data.__kind < 2;
  if (bVar1) {
    (**(code **)((in_RDI->super___mutex_base)._M_mutex.__align + 0x20))();
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::condition_variable::notify_all();
  }
  return;
}

Assistant:

void TPZReschedulableTask::start() {
    bool executed = false;
    {
        std::unique_lock<std::mutex> lock(mStateMutex);
        if (mState <= TPZReschedulableTask::SCHEDULED) {
            this->startInternal();
            executed = true;
        }
    }
    if (executed) {
        mCondition.notify_all();
    }
}